

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.hpp
# Opt level: O1

void __thiscall
webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::WebSocket
          (WebSocket<webfront::networking::TCPNetworkingTS> *this,Socket *netSocket)

{
  mutable_buffer local_28;
  completion_handler_type local_18;
  
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .service_ = (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.socket_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.socket_ = -1;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.state_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.state_ = '\0';
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.super_base_implementation_type.reactor_data_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.super_base_implementation_type.reactor_data_ = (per_descriptor_data)0x0;
  (this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ =
       (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
       super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
       .implementation_.protocol_.family_;
  (netSocket->super_basic_socket<std::experimental::net::v1::ip::tcp>).
  super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
  .implementation_.protocol_.family_ = 2;
  FrameDecoder::FrameDecoder(&this->decoder);
  (this->closeHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->closeHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->closeHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->closeHandler).super__Function_base._M_functor + 8) = 0;
  (this->binaryHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->binaryHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->binaryHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->binaryHandler).super__Function_base._M_functor + 8) = 0;
  (this->textHandler).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->textHandler)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->textHandler).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->textHandler).super__Function_base._M_functor + 8) = 0;
  this->started = false;
  local_28.data_ = &PTR_s__workspace_llm4binary_github_lic_0013d450;
  if (log::logTypeEnabled._4_1_ == '\x01') {
    log::anon_unknown_4::log(0.0);
  }
  this->started = true;
  local_28.data_ = &this->readBuffer;
  local_28.size_ = 0x2000;
  local_18.this = this;
  std::experimental::net::v1::detail::reactive_socket_service_base::
  async_receive<std::experimental::net::v1::mutable_buffer,webfront::websocket::WebSocket<webfront::networking::TCPNetworkingTS>::read()::_lambda(std::error_code,unsigned_long)_1_>
            (&((this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
               super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .service_)->super_reactive_socket_service_base,
             &(this->socket).super_basic_socket<std::experimental::net::v1::ip::tcp>.
              super_basic_io_object<std::experimental::net::v1::detail::reactive_socket_service<std::experimental::net::v1::ip::tcp>,_true>
              .implementation_.super_base_implementation_type,&local_28,0,&local_18);
  return;
}

Assistant:

explicit WebSocket(typename Net::Socket netSocket) : socket(std::move(netSocket)), started(false) {
        log::debug("WebSocket constructor");
        start();
    }